

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O2

bool __thiscall ManifestParser::ParseFileInclude(ManifestParser *this,bool new_scope,string *err)

{
  Lexer *this_00;
  bool bVar1;
  BindingEnv *this_01;
  EvalString eval;
  string path;
  Parser local_88;
  BindingEnv *local_40;
  ManifestParserOptions local_38;
  undefined1 local_30;
  
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar1 = Lexer::ReadPath(this_00,&eval,err);
  if (bVar1) {
    EvalString::Evaluate_abi_cxx11_(&path,&eval,&this->env_->super_Env);
    local_38 = this->options_;
    local_88.state_ = (this->super_Parser).state_;
    local_88.file_reader_ = (this->super_Parser).file_reader_;
    local_88.lexer_.filename_.str_ = (char *)0x0;
    local_88.lexer_.filename_.len_ = 0;
    local_88.lexer_.input_.str_ = (char *)0x0;
    local_88.lexer_.input_.len_ = 0;
    local_88._vptr_Parser = (_func_int **)&PTR_Parse_00130d68;
    local_30 = 0;
    if (new_scope) {
      this_01 = (BindingEnv *)operator_new(0x70);
      BindingEnv::BindingEnv(this_01,this->env_);
    }
    else {
      this_01 = this->env_;
    }
    local_40 = this_01;
    bVar1 = Parser::Load(&local_88,&path,err,this_00);
    if (bVar1) {
      bVar1 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&path);
  }
  else {
    bVar1 = false;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&eval.parsed_);
  return bVar1;
}

Assistant:

bool ManifestParser::ParseFileInclude(bool new_scope, string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  string path = eval.Evaluate(env_);

  ManifestParser subparser(state_, file_reader_, options_);
  if (new_scope) {
    subparser.env_ = new BindingEnv(env_);
  } else {
    subparser.env_ = env_;
  }

  if (!subparser.Load(path, err, &lexer_))
    return false;

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  return true;
}